

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O2

int mcpl2phits(char *inmcplfile,char *outphitsdumpfile,int use_polarisation,
              uint64_t nparticles_limit,int reclen)

{
  int32_t iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  long lVar6;
  uint64_t uVar7;
  size_t lbuf;
  ulong local_c0;
  mcpl_generic_wfilehandle_t fout;
  double local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  double dStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if ((reclen != 4) && (reclen != 8)) {
    phits_error(
               "Reclen parameter should be 4 (32bit Fortran record markers, recommended) or 8 (64bit Fortran record markers)"
               );
  }
  uVar2 = mcpl_open_file(inmcplfile);
  uVar3 = mcpl_hdr_srcname(uVar2);
  uVar4 = mcpl_hdr_nparticles(uVar2);
  printf("Opened MCPL file produced with \"%s\" (contains %llu particles)\n",uVar3,uVar4);
  puts("Creating (or overwriting) output PHITS file.");
  mcpl_generic_wfopen(&fout,outphitsdumpfile);
  if (fout.internal == (void *)0x0) {
    phits_error("Problems opening new PHITS file");
  }
  puts("Initiating particle conversion loop.");
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  dStack_50 = 0.0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0.0;
  uStack_90 = 0;
  local_38 = 0;
  lbuf = 0x68;
  if (use_polarisation == 0) {
    lbuf = 0x50;
  }
  local_c0 = 0;
  uVar7 = 0;
  do {
    while( true ) {
      puVar5 = (undefined8 *)mcpl_read(uVar2);
      if (puVar5 == (undefined8 *)0x0) goto LAB_001031f5;
      iVar1 = conv_code_pdg2phits(*(int32_t *)(puVar5 + 0xc));
      if (iVar1 != 0) break;
      local_c0 = local_c0 + 1;
      if ((local_c0 < 0x65) &&
         (printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to a PHITS particle code\n"
                 ,(long)*(int *)(puVar5 + 0xc)), local_c0 == 100)) {
        puts("WARNING: Suppressing future warnings regarding non-convertible PDG codes.");
        local_c0 = 100;
      }
    }
    local_98 = (double)iVar1;
    uStack_90 = puVar5[4];
    local_88 = puVar5[5];
    uStack_80 = puVar5[6];
    local_78 = puVar5[7];
    uStack_70 = puVar5[8];
    local_68 = puVar5[9];
    uStack_60 = *puVar5;
    local_58 = puVar5[0xb];
    dStack_50 = (double)puVar5[10] * 1000000.0;
    local_48 = puVar5[1];
    uStack_40 = puVar5[2];
    local_38 = puVar5[3];
    if (uVar7 == 0x7fffffff) {
      puts(
          "WARNING: Writing more than 2147483647 (maximum value of 32 bit integers) particles in the PHITS dump file - it is not known whether PHITS will be able to deal with such files correctly."
          );
    }
    phits_writerecord(&fout,reclen,lbuf,(char *)&local_98);
    uVar7 = uVar7 + 1;
  } while (nparticles_limit != uVar7);
  lVar6 = mcpl_hdr_nparticles(uVar2);
  lVar6 = lVar6 - (local_c0 + nparticles_limit);
  uVar7 = nparticles_limit;
  if (lVar6 != 0) {
    printf("Output limit of %llu particles reached. Ignoring remaining %llu particles in the MCPL file.\n"
           ,nparticles_limit,lVar6);
  }
LAB_001031f5:
  puts("Ending particle conversion loop.");
  if (local_c0 != 0) {
    printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes could not be converted to PHITS codes.\n"
           ,local_c0);
  }
  mcpl_close_file(uVar2);
  mcpl_generic_fwclose(&fout);
  printf("Created %s with %lli particles.\n",outphitsdumpfile,uVar7);
  return 1;
}

Assistant:

int mcpl2phits( const char * inmcplfile, const char * outphitsdumpfile,
                int use_polarisation, uint64_t nparticles_limit, int reclen )
{
  if ( reclen != 4 && reclen != 8 )
    phits_error("Reclen parameter should be 4 (32bit Fortran record markers,"
                " recommended) or 8 (64bit Fortran record markers)");

  mcpl_file_t fmcpl = mcpl_open_file(inmcplfile);

  printf( "Opened MCPL file produced with \"%s\" (contains %llu particles)\n",
          mcpl_hdr_srcname(fmcpl),
          (unsigned long long)mcpl_hdr_nparticles(fmcpl) );

  printf("Creating (or overwriting) output PHITS file.\n");

  //Open new phits file:
  mcpl_generic_wfilehandle_t fout = mcpl_generic_wfopen(outphitsdumpfile);

  if (!fout.internal)
    phits_error("Problems opening new PHITS file");

  uint64_t used = 0;
  uint64_t skipped_nophitstype = 0;

  printf("Initiating particle conversion loop.\n");

  double dumpdata[13] = {0.,0.,0.,0.,0.,0.,0.,0.,0.,0.,0.,0.,0.};//explicit since gcc 4.1-4.6 might warn on ={0}; syntax

  while ( 1 ) {
    const mcpl_particle_t* mcpl_p = mcpl_read(fmcpl);
    if ( !mcpl_p )
      break;
    int32_t rawtype =  conv_code_pdg2phits( mcpl_p->pdgcode );
    if (!rawtype) {
      ++skipped_nophitstype;
      if (skipped_nophitstype<=100) {
        printf("WARNING: Found PDG code (%li) in the MCPL file which can not be converted to a PHITS particle code\n",
               (long)mcpl_p->pdgcode);
        if (skipped_nophitstype==100)
          printf("WARNING: Suppressing future warnings regarding non-convertible PDG codes.\n");
      }
      continue;
    }

    assert(rawtype!=0);

    dumpdata[0] = rawtype;
    dumpdata[1] = mcpl_p->position[0];//Already in cm
    dumpdata[2] = mcpl_p->position[1];//Already in cm
    dumpdata[3] = mcpl_p->position[2];//Already in cm
    dumpdata[4] = mcpl_p->direction[0];
    dumpdata[5] = mcpl_p->direction[1];
    dumpdata[6] = mcpl_p->direction[2];
    dumpdata[7] = mcpl_p->ekin;//Already in MeV
    dumpdata[8] = mcpl_p->weight;
    dumpdata[9] = mcpl_p->time * 1.0e6;//ms->ns
    dumpdata[10] = mcpl_p->polarisation[0];
    dumpdata[11] = mcpl_p->polarisation[1];
    dumpdata[12] = mcpl_p->polarisation[2];

    if (used==INT32_MAX) {
      printf("WARNING: Writing more than 2147483647 (maximum value of 32 bit integers) particles in the PHITS dump "
             "file - it is not known whether PHITS will be able to deal with such files correctly.\n");
    }
    phits_writerecord(&fout,reclen,sizeof(double)*(use_polarisation?13:10),(char*)&dumpdata[0]);

    if (++used==nparticles_limit) {
      uint64_t remaining = mcpl_hdr_nparticles(fmcpl) - skipped_nophitstype - used;
      if (remaining)
        printf("Output limit of %llu particles reached. Ignoring"
               " remaining %llu particles in the MCPL file.\n",
               (unsigned long long)nparticles_limit,
               (unsigned long long)remaining );
      break;
    }


  }

  printf("Ending particle conversion loop.\n");

  if (skipped_nophitstype) {
    printf("WARNING: Ignored %lli particles in the input MCPL file since their PDG codes"
           " could not be converted to PHITS codes.\n",(long long)skipped_nophitstype);
  }
  mcpl_close_file(fmcpl);
  mcpl_generic_fwclose(&fout);

  printf("Created %s with %lli particles.\n",outphitsdumpfile,(long long)used);

  return 1;


}